

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O0

void enet_peer_reset_outgoing_commands(ENetList *queue)

{
  void *pvVar1;
  long *in_RDI;
  ENetOutgoingCommand *outgoingCommand;
  
  while ((long *)*in_RDI != in_RDI) {
    pvVar1 = enet_list_remove((ENetListIterator)*in_RDI);
    if ((*(long *)((long)pvVar1 + 0x60) != 0) &&
       (**(long **)((long)pvVar1 + 0x60) = **(long **)((long)pvVar1 + 0x60) + -1,
       **(long **)((long)pvVar1 + 0x60) == 0)) {
      enet_packet_destroy((ENetPacket *)0x107272);
    }
    enet_free((void *)0x10727e);
  }
  return;
}

Assistant:

static void
enet_peer_reset_outgoing_commands (ENetList * queue)
{
    ENetOutgoingCommand * outgoingCommand;

    while (! enet_list_empty (queue))
    {
       outgoingCommand = (ENetOutgoingCommand *) enet_list_remove (enet_list_begin (queue));

       if (outgoingCommand -> packet != NULL)
       {
          -- outgoingCommand -> packet -> referenceCount;

          if (outgoingCommand -> packet -> referenceCount == 0)
            enet_packet_destroy (outgoingCommand -> packet);
       }

       enet_free (outgoingCommand);
    }
}